

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O3

void WI_Start(wbstartstruct_t *wbstartstruct)

{
  noautostartmap = 0;
  V_SetBlend(0,0,0,0);
  acceleratestage = 0;
  bcnt = 0;
  cnt = 0;
  me = wbstartstruct->pnum;
  plrs = wbstartstruct->plyr;
  wbs = wbstartstruct;
  WI_loadData();
  if (deathmatch.Value == 0) {
    if (multiplayer == true) {
      WI_initNetgameStats();
    }
    else {
      state = StatCount;
      acceleratestage = 0;
      sp_state = 1;
      cnt_secret[0] = -1;
      cnt_items[0] = -1;
      cnt_kills[0] = -1;
      cnt_par = -1;
      cnt_time = -1;
      cnt_pause = 0x23;
      cnt_total_time = -1;
    }
  }
  else {
    WI_initDeathmatchStats();
  }
  S_StopAllChannels();
  SN_StopAllSequences();
  return;
}

Assistant:

void WI_Start (wbstartstruct_t *wbstartstruct)
{
	noautostartmap = false;
	V_SetBlend (0,0,0,0);
	WI_initVariables (wbstartstruct);
	WI_loadData ();
	if (deathmatch)
		WI_initDeathmatchStats();
	else if (multiplayer)
		WI_initNetgameStats();
	else
		WI_initStats();
	S_StopAllChannels ();
	SN_StopAllSequences ();
}